

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_type
                 (lysc_ctx *ctx,lysp_node *context_node,lysp_type *type_p,lysc_node_leaf *leaf)

{
  bool bVar1;
  LY_ERR LVar2;
  ulong local_a8;
  char **local_a0;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool in_unres;
  uint64_t count;
  uint64_t u;
  lysc_type **t;
  lysp_qname *dflt;
  lysc_node_leaf *leaf_local;
  lysp_type *type_p_local;
  lysp_node *context_node_local;
  lysc_ctx *ctx_local;
  
  bVar1 = false;
  if (leaf->units == (char *)0x0) {
    local_a0 = &leaf->units;
  }
  else {
    local_a0 = (char **)0x0;
  }
  dflt = (lysp_qname *)leaf;
  leaf_local = (lysc_node_leaf *)type_p;
  type_p_local = (lysp_type *)context_node;
  context_node_local = (lysp_node *)ctx;
  ctx_local._4_4_ =
       lys_compile_type(ctx,context_node,(leaf->field_0).node.flags,(leaf->field_0).node.name,type_p
                        ,&leaf->type,local_a0,(lysp_qname **)&t);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    LOCK();
    *(int *)(dflt[4].str + 0x1c) = *(int *)(dflt[4].str + 0x1c) + 1;
    UNLOCK();
    if ((((t == (lysc_type **)0x0) || (((ulong)dflt->str & 0x2000000) != 0)) ||
        (ctx_local._4_4_ =
              lysc_unres_leaf_dflt_add
                        ((lysc_ctx *)context_node_local,(lysc_node_leaf *)dflt,(lysp_qname *)t),
        ctx_local._4_4_ == LY_SUCCESS)) &&
       (ctx_local._4_4_ =
             lysc_unres_leafref_add
                       ((lysc_ctx *)context_node_local,(lysc_node_leaf *)dflt,
                        (lysp_module *)leaf_local->musts), ctx_local._4_4_ == LY_SUCCESS)) {
      if (*(int *)(dflt[4].str + 0x18) == 0xf) {
        u = *(uint64_t *)(dflt[4].str + 0x20);
        if (u == 0) {
          local_a8 = 0;
        }
        else {
          local_a8 = *(ulong *)(u - 8);
        }
        _ret__ = local_a8;
      }
      else {
        u = (uint64_t)(dflt + 4);
        _ret__ = 1;
      }
      for (count = 0; count < _ret__; count = count + 1) {
        if (*(int *)(*(long *)(u + count * 8) + 0x18) == 10) {
          if ((*(short *)&dflt->str == 8) && (*(byte *)&context_node_local->next[1].exts < 2)) {
            ly_vlog((ly_ctx *)context_node_local->parent,(char *)0x0,LYVE_SEMANTICS,
                    "Leaf-list of type \"empty\" is allowed only in YANG 1.1 modules.");
            return LY_EVALID;
          }
        }
        else if ((!bVar1) &&
                ((*(int *)(*(long *)(u + count * 8) + 0x18) == 7 ||
                 (*(int *)(*(long *)(u + count * 8) + 0x18) == 0xb)))) {
          LVar2 = lysc_unres_bitenum_add((lysc_ctx *)context_node_local,(lysc_node_leaf *)dflt);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar1 = true;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_type(struct lysc_ctx *ctx, struct lysp_node *context_node, struct lysp_type *type_p,
        struct lysc_node_leaf *leaf)
{
    struct lysp_qname *dflt;
    struct lysc_type **t;
    LY_ARRAY_COUNT_TYPE u, count;
    ly_bool in_unres = 0;

    LY_CHECK_RET(lys_compile_type(ctx, context_node, leaf->flags, leaf->name, type_p, &leaf->type,
            leaf->units ? NULL : &leaf->units, &dflt));
    LY_ATOMIC_INC_BARRIER(leaf->type->refcount);

    /* store default value, if any */
    if (dflt && !(leaf->flags & LYS_SET_DFLT)) {
        LY_CHECK_RET(lysc_unres_leaf_dflt_add(ctx, leaf, dflt));
    }

    /* store leafref(s) to be resolved */
    LY_CHECK_RET(lysc_unres_leafref_add(ctx, leaf, type_p->pmod));

    /* type-specific checks */
    if (leaf->type->basetype == LY_TYPE_UNION) {
        t = ((struct lysc_type_union *)leaf->type)->types;
        count = LY_ARRAY_COUNT(t);
    } else {
        t = &leaf->type;
        count = 1;
    }
    for (u = 0; u < count; ++u) {
        if (t[u]->basetype == LY_TYPE_EMPTY) {
            if ((leaf->nodetype == LYS_LEAFLIST) && (ctx->pmod->version < LYS_VERSION_1_1)) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Leaf-list of type \"empty\" is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else if (!in_unres && ((t[u]->basetype == LY_TYPE_BITS) || (t[u]->basetype == LY_TYPE_ENUM))) {
            /* store in unres for all disabled bits/enums to be removed */
            LY_CHECK_RET(lysc_unres_bitenum_add(ctx, leaf));
            in_unres = 1;
        }
    }

    return LY_SUCCESS;
}